

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

bool B000FFReadWriter::isB000FF(ByteVector *hdr)

{
  pointer puVar1;
  int iVar2;
  string magic;
  undefined4 *local_38;
  undefined8 local_30;
  undefined4 local_28;
  uint uStack_24;
  
  puVar1 = (hdr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = &local_28;
  if (puVar1 != (pointer)0x0) {
    local_28 = *(undefined4 *)puVar1;
    uStack_24 = *(uint *)(puVar1 + 3) >> 8;
    local_30 = 7;
    iVar2 = std::__cxx11::string::compare((char *)&local_38);
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT44(uStack_24,local_28) + 1);
    }
    return iVar2 == 0;
  }
  std::__throw_logic_error("basic_string::_M_construct null not valid");
}

Assistant:

region(const uint8_t *p)
        {
            type= get32le(p+0x0);
            pstart= get32le(p+0x4);
            psize= get32le(p+0x8);
            lsize= get32le(p+0xc);
            blksectors= get32le(p+0x10);
            blkbytes= get32le(p+0x14);
            compact= get32le(p+0x18);
        }